

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_t sVar4;
  pointer pOVar5;
  results_t *prVar6;
  ulong uVar7;
  element_type *peVar8;
  App *this_00;
  reference pvVar9;
  ExtrasError *this_01;
  App *local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  App *local_188;
  App *parent_app;
  App *com;
  shared_ptr<CLI::App> *subc;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string pos_1;
  Option_p *opt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string local_a8;
  undefined1 local_88 [8];
  string pos;
  Option_p *opt;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3;
  size_t remreq;
  size_type arg_rem;
  Option *posOpt;
  string *positional;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool haltOnSubcommand_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  positional._7_1_ = haltOnSubcommand;
  pvStack_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  posOpt = (Option *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  arg_rem = 0;
  if ((this->positionals_at_end_ & 1U) != 0) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_20);
    sVar4 = _count_remaining_positionals(this,true);
    if (sVar3 <= sVar4) {
      __end3 = std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::begin(&this->options_);
      opt = (Option_p *)
            std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::end(&this->options_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                         *)&opt), bVar1) {
        pos.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end3);
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos.field_2._8_8_);
        bVar1 = Option::get_positional(pOVar5);
        if ((bVar1) &&
           (pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                pos.field_2._8_8_),
           ((pOVar5->super_OptionBase<CLI::Option>).required_ & 1U) != 0)) {
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos.field_2._8_8_);
          sVar4 = Option::count(pOVar5);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos.field_2._8_8_);
          iVar2 = Option::get_items_expected_min(pOVar5);
          if ((int)sVar4 < iVar2) {
            if ((this->validate_positionals_ & 1U) != 0) {
              ::std::__cxx11::string::string((string *)local_88,(string *)posOpt);
              pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                 ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                  pos.field_2._8_8_);
              Option::_validate(&local_a8,pOVar5,(string *)local_88,0);
              ::std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
              ::std::__cxx11::string::~string((string *)&local_a8);
              uVar7 = ::std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                __range2._0_4_ = 3;
              }
              else {
                __range2._0_4_ = 0;
              }
              ::std::__cxx11::string::~string((string *)local_88);
              if ((int)__range2 != 0) goto LAB_00164a6a;
            }
            arg_rem = (size_type)
                      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                 pos.field_2._8_8_);
            break;
          }
        }
LAB_00164a6a:
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  if (arg_rem == 0) {
    __end2 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
    opt_1 = (Option_p *)
            std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::end(&this->options_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                       *)&opt_1), bVar1) {
      pos_1.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
           ::operator*(&__end2);
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          pos_1.field_2._8_8_);
      bVar1 = Option::get_positional(pOVar5);
      if (bVar1) {
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos_1.field_2._8_8_);
        sVar4 = Option::count(pOVar5);
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos_1.field_2._8_8_);
        iVar2 = Option::get_items_expected_max(pOVar5);
        if (iVar2 <= (int)sVar4) {
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos_1.field_2._8_8_);
          bVar1 = Option::get_allow_extra_args(pOVar5);
          if (!bVar1) goto LAB_00164c4d;
        }
        if ((this->validate_positionals_ & 1U) != 0) {
          ::std::__cxx11::string::string((string *)local_f8,(string *)posOpt);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos_1.field_2._8_8_);
          Option::_validate(&local_118,pOVar5,(string *)local_f8,0);
          ::std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
          ::std::__cxx11::string::~string((string *)&local_118);
          uVar7 = ::std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            __range2._0_4_ = 5;
          }
          else {
            __range2._0_4_ = 0;
          }
          ::std::__cxx11::string::~string((string *)local_f8);
          if ((int)__range2 != 0) goto LAB_00164c4d;
        }
        arg_rem = (size_type)
                  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             pos_1.field_2._8_8_);
        break;
      }
LAB_00164c4d:
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if (arg_rem == 0) {
    __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar1) {
      com = (App *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                   ::operator*(&__end1);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)com);
      uVar7 = ::std::__cxx11::string::empty();
      if (((uVar7 & 1) != 0) &&
         (peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)com), (peVar8->disabled_ & 1U) == 0)) {
        peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)com);
        bVar1 = _parse_positional(peVar8,pvStack_20,false);
        if (bVar1) {
          peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)com);
          if ((peVar8->pre_parse_called_ & 1U) == 0) {
            peVar8 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)com);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(pvStack_20);
            _trigger_pre_parse(peVar8,sVar3);
          }
          return true;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end1);
    }
    if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(pvStack_20);
      parent_app = _find_subcommand(this,pvVar9,true,false);
      if ((parent_app == (App *)0x0) ||
         ((this->require_subcommand_max_ != 0 &&
          (uVar7 = this->require_subcommand_max_,
          sVar3 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                            (&this->parsed_subcommands_), uVar7 <= sVar3)))) {
        if ((this->subcommand_fallthrough_ & 1U) != 0) {
          local_218 = this;
          if (this->parent_ != (App *)0x0) {
            local_218 = _get_fallthrough_parent(this);
          }
          local_188 = local_218;
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(pvStack_20);
          parent_app = _find_subcommand(local_218,pvVar9,true,false);
          if ((parent_app != (App *)0x0) &&
             ((parent_app->parent_->require_subcommand_max_ == 0 ||
              (uVar7 = parent_app->parent_->require_subcommand_max_,
              sVar3 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                                (&parent_app->parent_->parsed_subcommands_), sVar3 < uVar7)))) {
            return false;
          }
        }
        if ((this->positionals_at_end_ & 1U) != 0) {
          this_01 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_1a0,pvStack_20);
          ExtrasError::ExtrasError(this_01,&this->name_,&local_1a0);
          __cxa_throw(this_01,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
        }
        if ((this->parent_ == (App *)0x0) ||
           (uVar7 = ::std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
          _move_to_missing(this,NONE,(string *)posOpt);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(pvStack_20);
          if ((this->prefix_command_ & 1U) != 0) {
            while (bVar1 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::empty(pvStack_20), ((bVar1 ^ 0xffU) & 1) != 0) {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::back(pvStack_20);
              _move_to_missing(this,NONE,pvVar9);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(pvStack_20);
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else if ((positional._7_1_ & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(pvStack_20);
        _parse(parent_app,pvStack_20);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_00 = _get_fallthrough_parent(this);
      args_00 = pvStack_20;
      bVar1 = ::std::function::operator_cast_to_bool((function *)&this->parse_complete_callback_);
      this_local._7_1_ = _parse_positional(this_00,args_00,bVar1);
    }
  }
  else {
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,(value_type *)&arg_rem);
    bVar1 = Option::get_inject_separator((Option *)arg_rem);
    if (bVar1) {
      prVar6 = Option::results_abi_cxx11_((Option *)arg_rem);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(prVar6);
      if (!bVar1) {
        prVar6 = Option::results_abi_cxx11_((Option *)arg_rem);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back(prVar6);
        uVar7 = ::std::__cxx11::string::empty();
        sVar3 = arg_rem;
        if ((uVar7 & 1) == 0) {
          ::std::__cxx11::string::string((string *)&local_138);
          Option::add_result((Option *)sVar3,&local_138);
          ::std::__cxx11::string::~string((string *)&local_138);
        }
      }
    }
    bVar1 = Option::get_trigger_on_parse((Option *)arg_rem);
    if ((bVar1) && (*(char *)(arg_rem + 0x248) == '\x06')) {
      Option::clear((Option *)arg_rem);
    }
    sVar3 = arg_rem;
    ::std::__cxx11::string::string((string *)&__range1,(string *)posOpt);
    Option::add_result((Option *)sVar3,(string *)&__range1);
    ::std::__cxx11::string::~string((string *)&__range1);
    bVar1 = Option::get_trigger_on_parse((Option *)arg_rem);
    if (bVar1) {
      Option::run_callback((Option *)arg_rem);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(pvStack_20);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

CLI11_INLINE bool App::_parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

    const std::string &positional = args.back();
    Option *posOpt{nullptr};

    if(positionals_at_end_) {
        // deal with the case of required arguments at the end which should take precedence over other arguments
        auto arg_rem = args.size();
        auto remreq = _count_remaining_positionals(true);
        if(arg_rem <= remreq) {
            for(const Option_p &opt : options_) {
                if(opt->get_positional() && opt->required_) {
                    if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                        if(validate_positionals_) {
                            std::string pos = positional;
                            pos = opt->_validate(pos, 0);
                            if(!pos.empty()) {
                                continue;
                            }
                        }
                        posOpt = opt.get();
                        break;
                    }
                }
            }
        }
    }
    if(posOpt == nullptr) {
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_max() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                posOpt = opt.get();
                break;
            }
        }
    }
    if(posOpt != nullptr) {
        parse_order_.push_back(posOpt);
        if(posOpt->get_inject_separator()) {
            if(!posOpt->results().empty() && !posOpt->results().back().empty()) {
                posOpt->add_result(std::string{});
            }
        }
        if(posOpt->get_trigger_on_parse() && posOpt->current_option_state_ == Option::option_state::callback_run) {
            posOpt->clear();
        }
        posOpt->add_result(positional);
        if(posOpt->get_trigger_on_parse()) {
            posOpt->run_callback();
        }

        args.pop_back();
        return true;
    }

    for(auto &subc : subcommands_) {
        if((subc->name_.empty()) && (!subc->disabled_)) {
            if(subc->_parse_positional(args, false)) {
                if(!subc->pre_parse_called_) {
                    subc->_trigger_pre_parse(args.size());
                }
                return true;
            }
        }
    }
    // let the parent deal with it if possible
    if(parent_ != nullptr && fallthrough_) {
        return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));
    }
    /// Try to find a local subcommand that is repeated
    auto *com = _find_subcommand(args.back(), true, false);
    if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
        if(haltOnSubcommand) {
            return false;
        }
        args.pop_back();
        com->_parse(args);
        return true;
    }
    if(subcommand_fallthrough_) {
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto *parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }
    }
    if(positionals_at_end_) {
        throw CLI::ExtrasError(name_, args);
    }
    /// If this is an option group don't deal with it
    if(parent_ != nullptr && name_.empty()) {
        return false;
    }
    /// We are out of other options this goes to missing
    _move_to_missing(detail::Classifier::NONE, positional);
    args.pop_back();
    if(prefix_command_) {
        while(!args.empty()) {
            _move_to_missing(detail::Classifier::NONE, args.back());
            args.pop_back();
        }
    }

    return true;
}